

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

void createSimpleFeatureVectorizerModel
               (Model *spec,char *outputName,ArrayFeatureType_ArrayDataType arrayType,int inputSize)

{
  ulong uVar1;
  int iVar2;
  ModelDescription *this;
  Metadata *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  FeatureVectorizer *pFVar7;
  FeatureVectorizer_InputColumn *pFVar8;
  undefined8 *puVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  spec->specificationversion_ = 9;
  this = CoreML::Specification::Model::_internal_mutable_description(spec);
  pMVar3 = CoreML::Specification::ModelDescription::_internal_mutable_metadata(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Testing serialization",(allocator<char> *)&local_50);
  uVar1 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&pMVar3->shortdescription_,&local_70,puVar9);
  std::__cxx11::string::~string((string *)&local_70);
  iVar10 = 0;
  iVar2 = 0;
  if (0 < inputSize) {
    iVar2 = inputSize;
  }
  for (; iVar2 != iVar10; iVar10 = iVar10 + 1) {
    pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&this->input_);
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    CoreML::Specification::FeatureType::_internal_mutable_doubletype(pFVar5);
    std::__cxx11::to_string(&local_50,iVar10);
    std::operator+(&local_70,"input",&local_50);
    uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
    puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar9 = (undefined8 *)*puVar9;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&pFVar4->name_,&local_70,puVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    CoreML::Specification::FeatureDescription::set_allocated_type(pFVar4,pFVar5);
  }
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this->output_);
  pFVar5 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar5);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  local_70._M_dataplus._M_p = (pointer)(long)inputSize;
  google::protobuf::RepeatedField<long>::Add(&pAVar6->shape_,(long *)&local_70);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = arrayType;
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,outputName,puVar9);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar4,pFVar5);
  pFVar7 = CoreML::Specification::Model::_internal_mutable_featurevectorizer(spec);
  for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
    pFVar8 = google::protobuf::
             RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::Add
                       (&pFVar7->inputlist_);
    std::__cxx11::to_string(&local_50,iVar10);
    std::operator+(&local_70,"input",&local_50);
    uVar1 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar9 = (undefined8 *)*puVar9;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&pFVar8->inputcolumn_,&local_70,puVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar8->inputdimensions_ = 1;
  }
  return;
}

Assistant:

void createSimpleFeatureVectorizerModel(Specification::Model *spec, const char *outputName, Specification::ArrayFeatureType_ArrayDataType arrayType, int inputSize) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    
    auto interface = spec->mutable_description();
    auto metadata = interface->mutable_metadata();
    metadata->set_shortdescription(std::string("Testing serialization"));
    
    for (int d = 0; d < inputSize; d++) {
        auto input = interface->add_input();
        auto inputType = new Specification::FeatureType;
        inputType->mutable_doubletype();
        input->set_name("input" + std::to_string(d));
        input->set_allocated_type(inputType);
    }
    
    auto output = interface->add_output();
    auto outputType = new Specification::FeatureType;
    outputType->mutable_multiarraytype()->mutable_shape()->Add(inputSize);
    outputType->mutable_multiarraytype()->set_datatype(arrayType);
    output->set_name(outputName);
    output->set_allocated_type(outputType);
    
    auto featurVectorizerModel = spec->mutable_featurevectorizer();
    
    for (int d = 0; d < inputSize; d++) {
        auto inputlist = featurVectorizerModel->add_inputlist();
        inputlist->set_inputcolumn("input" + std::to_string(d));
        inputlist->set_inputdimensions(1);
    }
    
}